

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O0

uint32_t __thiscall
ELFIO::endianness_convertor::operator()(endianness_convertor *this,uint32_t value)

{
  uint32_t value_local;
  endianness_convertor *this_local;
  
  this_local._4_4_ = value;
  if ((this->need_conversion & 1U) != 0) {
    this_local._4_4_ =
         value << 0x18 | (value & 0xff00) << 8 | (value & 0xff0000) >> 8 | value >> 0x18;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t operator()( uint32_t value ) const
    {
        if ( !need_conversion ) {
            return value;
        }
        value =
            ( ( value & 0x000000FF ) << 24 ) | ( ( value & 0x0000FF00 ) << 8 ) |
            ( ( value & 0x00FF0000 ) >> 8 ) | ( ( value & 0xFF000000 ) >> 24 );

        return value;
    }